

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

bool __thiscall
Jinx::Impl::Parser::CheckPropertyName
          (Parser *this,LibraryIPtr *library,SymbolListCItr currSym,size_t *symCount)

{
  bool bVar1;
  pointer pSVar2;
  element_type *peVar3;
  bool local_9d;
  bool exists;
  Symbol *local_80;
  size_t i;
  size_t sc;
  String name;
  SymbolListCItr curr;
  size_t s;
  size_t maxParts;
  size_t *local_30;
  size_t *symCount_local;
  LibraryIPtr *library_local;
  Parser *this_local;
  SymbolListCItr currSym_local;
  
  local_9d = true;
  local_30 = symCount;
  symCount_local = (size_t *)library;
  library_local = (LibraryIPtr *)this;
  this_local = (Parser *)currSym._M_current;
  if ((this->m_error & 1U) == 0) {
    maxParts = (size_t)std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                                 (this->m_symbolList);
    local_9d = __gnu_cxx::operator==
                         ((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                           *)&this_local,
                          (__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                           *)&maxParts);
  }
  if (local_9d == false) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                           *)&this_local);
    if (pSVar2->type == NameValue) {
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)library);
      for (curr._M_current = (Symbol *)Library::GetMaxPropertyParts(peVar3);
          curr._M_current != (Symbol *)0x0;
          curr._M_current = (Symbol *)((long)&curr._M_current[-1].columnNumber + 3)) {
        name.field_2._8_8_ = this_local;
        pSVar2 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                               *)((long)&name.field_2 + 8));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&sc,
                     &pSVar2->text);
        i = 1;
        for (local_80 = (Symbol *)0x1; local_80 < curr._M_current;
            local_80 = (Symbol *)((long)&local_80->type + 1)) {
          __gnu_cxx::
          __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
          ::operator++((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                        *)((long)&name.field_2 + 8));
          bVar1 = IsSymbolValid(this,(SymbolListCItr)name.field_2._8_8_);
          if (bVar1) {
            pSVar2 = __gnu_cxx::
                     __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                     ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                                   *)((long)&name.field_2 + 8));
            bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                    ::empty(&pSVar2->text);
            if (!bVar1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&sc,
                         " ");
              pSVar2 = __gnu_cxx::
                       __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                       ::operator->((__normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                                     *)((long)&name.field_2 + 8));
              std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&sc,
                         &pSVar2->text);
              i = i + 1;
            }
          }
        }
        peVar3 = std::
                 __shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)library);
        bVar1 = Library::PropertyNameExists(peVar3,(String *)&sc);
        if (bVar1) {
          if (local_30 != (size_t *)0x0) {
            *local_30 = i;
          }
          currSym_local._M_current._7_1_ = 1;
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&sc);
        if (bVar1) goto LAB_002de3fd;
      }
      currSym_local._M_current._7_1_ = 0;
    }
    else {
      currSym_local._M_current._7_1_ = 0;
    }
  }
  else {
    currSym_local._M_current._7_1_ = 0;
  }
LAB_002de3fd:
  return (bool)(currSym_local._M_current._7_1_ & 1);
}

Assistant:

inline_t bool Parser::CheckPropertyName(LibraryIPtr library, SymbolListCItr currSym, size_t * symCount) const
	{
		// Internal function called once we've established a library to check
		// Check up to the max number of parts

		// Initial error checks
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check for names starting with max property count
		auto maxParts = library->GetMaxPropertyParts();
		for (size_t s = maxParts; s > 0; --s)
		{
			auto curr = currSym;
			auto name = String(curr->text);
			size_t sc = 1;
			for (size_t i = 1; i < s; ++i)
			{
				++curr;
				if (!IsSymbolValid(curr) || curr->text.empty())
					continue;
				name += " ";
				name += curr->text;
				++sc;
			}
			bool exists = library->PropertyNameExists(name);
			if (exists)
			{
				if (symCount)
					*symCount = sc;
				return true;
			}
		}
		return false;
	}